

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AddCleanup
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  _func_void_void_ptr *unaff_retaddr;
  void *in_stack_00000008;
  
  if (*(long *)(in_RDI + 0x38) == *(long *)(in_RDI + 0x40)) {
    AddCleanupFallback((SerialArena *)cleanup,in_stack_00000008,unaff_retaddr);
  }
  else {
    **(undefined8 **)(in_RDI + 0x38) = in_RSI;
    *(undefined8 *)(*(long *)(in_RDI + 0x38) + 8) = in_RDX;
    *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 0x10;
  }
  return;
}

Assistant:

void AddCleanup(void* elem, void (*cleanup)(void*)) {
      if (PROTOBUF_PREDICT_FALSE(cleanup_ptr_ == cleanup_limit_)) {
        AddCleanupFallback(elem, cleanup);
        return;
      }
      cleanup_ptr_->elem = elem;
      cleanup_ptr_->cleanup = cleanup;
      cleanup_ptr_++;
    }